

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeFloatArray
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint uVar1;
  code *pcVar2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  byte *pbVar7;
  byte *buffer_00;
  ulong uVar8;
  ulong uVar9;
  double local_40;
  double value;
  
  uVar1 = *(uint *)buffer;
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 <= (ulong)uVar1 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x12c2,
                                "(serialized->offset + sizeof(AuxArray<double>) < deserializeInto->GetLength())"
                                ,
                                "serialized->offset + sizeof(AuxArray<double>) < deserializeInto->GetLength()"
                               );
    if (!bVar4) goto LAB_00896957;
    *puVar6 = 0;
  }
  pbVar7 = ByteBlock::GetBuffer(deserializeInto);
  value = (double)(ulong)*(uint *)buffer;
  uVar9 = (ulong)*(uint *)(buffer + 5);
  *(uint *)(pbVar7 + (long)value) = *(uint *)(buffer + 5);
  uVar1 = *(uint *)buffer;
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 < (ulong)uVar1 + uVar9 * 8 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x12c6,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar4) {
LAB_00896957:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  dVar3 = value;
  buffer_00 = buffer + 9;
  if (uVar9 != 0) {
    uVar8 = 0;
    do {
      buffer_00 = ReadDouble(buffer_00,
                             (size_t)(this->raw + ((long)this->totalSize - (long)buffer_00)),
                             &local_40);
      *(double *)(pbVar7 + uVar8 * 8 + (long)dVar3 + 8) = local_40;
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  return buffer_00;
}

Assistant:

const byte *
    DeserializeFloatArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const SerializedFloatArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxFltArray);
#endif
        Assert(serialized->offset + sizeof(AuxArray<double>) < deserializeInto->GetLength());
        auto result = (AuxArray<double> *)(deserializeInto->GetBuffer() + serialized->offset);
        uint count = serialized->floatCount;
        result->count = count;
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto content = (const byte*)(serialized + 1);
        auto current = content;
        for (uint index = 0; index < count; index++)
        {
            double value;
            current = ReadDouble(current, &value);
            result->elements[index] = value;
        }
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxFltArray);
#endif
        return current;
    }